

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_value.hpp
# Opt level: O2

value_ptr pstore::dump::make_value<char>(extent<char> ex)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar1;
  value_ptr vVar2;
  initializer_list<pstore::dump::object::member> __l;
  address in_stack_fffffffffffffee0;
  value_ptr local_118;
  value_ptr local_108;
  shared_ptr<pstore::dump::object> v;
  extent<char> ex_local;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_d8;
  string local_c0;
  string local_a0;
  member local_80 [2];
  
  std::__cxx11::string::string((string *)&local_a0,"addr",(allocator *)&stack0xfffffffffffffee7);
  make_value(in_stack_fffffffffffffee0);
  object::member::member(local_80,&local_a0,&local_108);
  std::__cxx11::string::string((string *)&local_c0,"size",(allocator *)&stack0xfffffffffffffee6);
  make_value((uint64_t *)&local_118);
  object::member::member(local_80 + 1,&local_c0,&local_118);
  __l._M_len = 2;
  __l._M_array = local_80;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_d8,__l,(allocator_type *)&stack0xfffffffffffffee5);
  std::
  make_shared<pstore::dump::object,std::vector<pstore::dump::object::member,std::allocator<pstore::dump::object::member>>>
            ((vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> *)
             &v);
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_d8);
  lVar1 = 0x30;
  do {
    object::member::~member((member *)((long)&local_80[0].property._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_118.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_108.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_a0);
  (v.super___shared_ptr<pstore::dump::object,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->compact_ = true;
  std::static_pointer_cast<pstore::dump::value,pstore::dump::object>
            ((shared_ptr<pstore::dump::object> *)ex.addr.a_.a_.a_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v.super___shared_ptr<pstore::dump::object,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  vVar2.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  vVar2.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)ex.addr.a_.a_.a_;
  return (value_ptr)vVar2.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_ptr make_value (extent<T> ex) {
            auto const v = std::make_shared<object> (object::container{
                {"addr", make_value (ex.addr)},
                {"size", make_value (ex.size)},
            });
            v->compact ();
            return std::static_pointer_cast<value> (v);
        }